

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

void Glucose_ReadDimacs(char *pFileName,SimpSolver *s)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  Var v;
  byte *pbVar4;
  int c;
  Lit local_44;
  vec<Gluco::Lit> *local_40;
  byte *local_38;
  
  pbVar3 = (byte *)Extra_FileReadContents(pFileName);
  if ((s->super_Solver).user_lits.data != (Lit *)0x0) {
    (s->super_Solver).user_lits.sz = 0;
  }
  local_40 = &(s->super_Solver).user_lits;
  v = 0;
  local_38 = pbVar3;
  do {
    bVar1 = *pbVar3;
    if ((bVar1 == 99) || (bVar1 == 0x70)) {
      pbVar3 = pbVar3 + -1;
      do {
        pbVar4 = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      } while (*pbVar4 != 10);
    }
    else {
      if (bVar1 == 0) {
        free(local_38);
        return;
      }
      while( true ) {
        pbVar4 = pbVar3 + 1;
        if (0x2d < bVar1) break;
        if ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0) {
          if ((ulong)bVar1 == 0x2d) {
            bVar1 = *pbVar4;
            c = 1;
            pbVar3 = pbVar4;
            goto LAB_004b5448;
          }
          break;
        }
        bVar1 = *pbVar4;
        pbVar3 = pbVar4;
      }
      c = 0;
LAB_004b5448:
      iVar2 = atoi((char *)(pbVar3 + (bVar1 == 0x2b)));
      if (iVar2 == 0) {
        if (0 < (s->super_Solver).user_lits.sz) {
          Gluco::SimpSolver::addVar(s,v);
          Gluco::SimpSolver::addClause(s,local_40);
          if ((s->super_Solver).user_lits.data != (Lit *)0x0) {
            (s->super_Solver).user_lits.sz = 0;
          }
        }
      }
      else {
        iVar2 = iVar2 + -1;
        if (v <= iVar2) {
          v = iVar2;
        }
        local_44.x = Abc_Var2Lit(iVar2,c);
        Gluco::vec<Gluco::Lit>::push(local_40,&local_44);
      }
      pbVar3 = pbVar3 + ((ulong)(bVar1 == 0x2b) - 1);
      do {
        pbVar4 = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      } while ((byte)(*pbVar4 - 0x30) < 10);
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

void Glucose_ReadDimacs( char * pFileName, SimpSolver& s )
{
    vec<Lit> * lits = &s.user_lits;
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pTemp; int fComp, Var, VarMax = 0;
    lits->clear();
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == 'c' || *pTemp == 'p' ) {
            while ( *pTemp != '\n' )
                pTemp++;
            continue;
        }
        while ( *pTemp == ' ' || *pTemp == '\t' || *pTemp == '\r' || *pTemp == '\n' )
            pTemp++;
        fComp = 0;
        if ( *pTemp == '-' )
            fComp = 1, pTemp++;
        if ( *pTemp == '+' )
            pTemp++;
        Var = atoi( pTemp );
        if ( Var == 0 ) {
            if ( lits->size() > 0 ) {
                s.addVar( VarMax );
                s.addClause(*lits);
                lits->clear();
            }
        }
        else {
            Var--;
            VarMax = Abc_MaxInt( VarMax, Var );
            lits->push( toLit(Abc_Var2Lit(Var, fComp)) );
        }
        while ( *pTemp >= '0' && *pTemp <= '9' )
            pTemp++;
    }
    ABC_FREE( pBuffer );
}